

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

void __thiscall
cmSearchPath::AddPrefixPaths
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,char *base)

{
  cmMakefile *pcVar1;
  bool bVar2;
  reference __lhs;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  string *psVar6;
  bool local_362;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  string add;
  cmAlphaNum local_2c0;
  cmAlphaNum local_290;
  string local_260;
  cmAlphaNum local_240;
  cmAlphaNum local_210;
  string local_1e0;
  cmAlphaNum local_1c0;
  cmAlphaNum local_190;
  string local_160;
  byte local_13b;
  byte local_13a;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  string *local_f0;
  allocator<char> local_e1;
  string local_e0;
  cmValue local_c0;
  cmValue arch;
  string prefix;
  string dir;
  string *path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string subdir;
  char *base_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  cmSearchPath *this_local;
  
  subdir.field_2._8_8_ = base;
  if (this->FC != (cmFindCommon *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"bin",&local_41);
    std::allocator<char>::~allocator(&local_41);
    bVar2 = std::operator==(&this->FC->CMakePathName,"INCLUDE");
    if (bVar2) {
      std::__cxx11::string::operator=((string *)local_40,"include");
    }
    else {
      bVar2 = std::operator==(&this->FC->CMakePathName,"LIBRARY");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_40,"lib");
      }
      else {
        bVar2 = std::operator==(&this->FC->CMakePathName,"FRAMEWORK");
        if (bVar2) {
          std::__cxx11::string::clear();
        }
      }
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(paths);
    path = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(paths);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&path), bVar2) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
      std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8),(string *)__lhs);
      uVar3 = std::__cxx11::string::empty();
      if ((((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
         (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 != '/')) {
        std::__cxx11::string::operator+=((string *)(prefix.field_2._M_local_buf + 8),"/");
      }
      std::__cxx11::string::string((string *)&arch,(string *)(prefix.field_2._M_local_buf + 8));
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&arch,"/"), bVar2)) {
        lVar5 = std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)&arch,lVar5 - 1);
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"include");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"lib"), bVar2)) {
        pcVar1 = this->FC->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"CMAKE_LIBRARY_ARCHITECTURE",&local_e1);
        local_c0 = cmMakefile::GetDefinition(pcVar1,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
        local_f0 = local_c0.Value;
        bVar2 = cmNonempty(local_c0);
        if (bVar2) {
          pcVar1 = this->FC->Makefile;
          std::allocator<char>::allocator();
          local_13a = 0;
          local_13b = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"CMAKE_SYSROOT",&local_111);
          bVar2 = cmMakefile::IsDefinitionSet(pcVar1,&local_110);
          local_362 = false;
          if (bVar2) {
            pcVar1 = this->FC->Makefile;
            std::allocator<char>::allocator();
            local_13a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,"CMAKE_PREFIX_LIBRARY_ARCHITECTURE",&local_139);
            local_13b = 1;
            local_362 = cmMakefile::IsDefinitionSet(pcVar1,&local_138);
          }
          if ((local_13b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_138);
          }
          if ((local_13a & 1) != 0) {
            std::allocator<char>::~allocator(&local_139);
          }
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator(&local_111);
          if (local_362 == false) {
            cmAlphaNum::cmAlphaNum(&local_290,(string *)((long)&prefix.field_2 + 8));
            cmAlphaNum::cmAlphaNum(&local_2c0,(string *)local_40);
            add.field_2._M_local_buf[0xf] = '/';
            psVar6 = cmValue::operator*[abi_cxx11_(&local_c0);
            cmStrCat<char,std::__cxx11::string>
                      (&local_260,&local_290,&local_2c0,add.field_2._M_local_buf + 0xf,psVar6);
            AddPathInternal(this,&local_260,(string *)&arch,(char *)subdir.field_2._8_8_);
            std::__cxx11::string::~string((string *)&local_260);
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_190,'/');
            psVar6 = cmValue::operator*[abi_cxx11_(&local_c0);
            cmAlphaNum::cmAlphaNum(&local_1c0,psVar6);
            cmStrCat<std::__cxx11::string,std::__cxx11::string>
                      (&local_160,&local_190,&local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&prefix.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
            cmAlphaNum::cmAlphaNum(&local_210,'/');
            psVar6 = cmValue::operator*[abi_cxx11_(&local_c0);
            cmAlphaNum::cmAlphaNum(&local_240,psVar6);
            cmStrCat<std::__cxx11::string>
                      (&local_1e0,&local_210,&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arch);
            AddPathInternal(this,&local_160,&local_1e0,(char *)subdir.field_2._8_8_);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::string::~string((string *)&local_160);
          }
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&prefix.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2e8,"/");
      if (bVar2) {
        AddPathInternal(this,(string *)local_2e8,(string *)&arch,(char *)subdir.field_2._8_8_);
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"bin");
      if (bVar2) {
        std::operator+(&local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&prefix.field_2 + 8),"sbin");
        AddPathInternal(this,&local_308,(string *)&arch,(char *)subdir.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_308);
      }
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) && (bVar2 = std::operator!=(__lhs,"/"), bVar2)) {
        AddPathInternal(this,__lhs,(string *)&arch,(char *)subdir.field_2._8_8_);
      }
      std::__cxx11::string::~string((string *)local_2e8);
      std::__cxx11::string::~string((string *)&arch);
      std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  __assert_fail("this->FC != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSearchPath.cxx"
                ,0x9c,
                "void cmSearchPath::AddPrefixPaths(const std::vector<std::string> &, const char *)")
  ;
}

Assistant:

void cmSearchPath::AddPrefixPaths(const std::vector<std::string>& paths,
                                  const char* base)
{
  assert(this->FC != nullptr);

  // default for programs
  std::string subdir = "bin";

  if (this->FC->CMakePathName == "INCLUDE") {
    subdir = "include";
  } else if (this->FC->CMakePathName == "LIBRARY") {
    subdir = "lib";
  } else if (this->FC->CMakePathName == "FRAMEWORK") {
    subdir.clear(); // ? what to do for frameworks ?
  }

  for (std::string const& path : paths) {
    std::string dir = path;
    if (!subdir.empty() && !dir.empty() && dir.back() != '/') {
      dir += "/";
    }
    std::string prefix = dir;
    if (!prefix.empty() && prefix != "/") {
      prefix.erase(prefix.size() - 1);
    }
    if (subdir == "include" || subdir == "lib") {
      cmValue arch =
        this->FC->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE");
      if (cmNonempty(arch)) {
        if (this->FC->Makefile->IsDefinitionSet("CMAKE_SYSROOT") &&
            this->FC->Makefile->IsDefinitionSet(
              "CMAKE_PREFIX_LIBRARY_ARCHITECTURE")) {
          this->AddPathInternal(cmStrCat('/', *arch, dir, subdir),
                                cmStrCat('/', *arch, prefix), base);
        } else {
          this->AddPathInternal(cmStrCat(dir, subdir, '/', *arch), prefix,
                                base);
        }
      }
    }
    std::string add = dir + subdir;
    if (add != "/") {
      this->AddPathInternal(add, prefix, base);
    }
    if (subdir == "bin") {
      this->AddPathInternal(dir + "sbin", prefix, base);
    }
    if (!subdir.empty() && path != "/") {
      this->AddPathInternal(path, prefix, base);
    }
  }
}